

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyDefinition.cxx
# Opt level: O2

void __thiscall
cmPropertyDefinition::DefineProperty
          (cmPropertyDefinition *this,string *name,ScopeType scope,char *shortDescription,
          char *fullDescription,bool chain)

{
  std::__cxx11::string::_M_assign((string *)this);
  this->Scope = scope;
  this->Chained = chain;
  if (shortDescription != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->ShortDescription);
  }
  if (fullDescription != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->FullDescription);
    return;
  }
  return;
}

Assistant:

void cmPropertyDefinition::DefineProperty(const std::string& name,
                                          cmProperty::ScopeType scope,
                                          const char* shortDescription,
                                          const char* fullDescription,
                                          bool chain)
{
  this->Name = name;
  this->Scope = scope;
  this->Chained = chain;
  if (shortDescription) {
    this->ShortDescription = shortDescription;
  }
  if (fullDescription) {
    this->FullDescription = fullDescription;
  }
}